

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mfdcr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 arg2;
  uintptr_t o;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    arg2 = tcg_const_i64_ppc64(tcg_ctx,(ulong)(ctx->opcode >> 6 & 0x3e0 | ctx->opcode >> 0x10 & 0x1f
                                              ));
    gen_helper_load_dcr(tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
                        tcg_ctx->cpu_env,arg2);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_mfdcr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv dcrn;

    CHK_SV;
    dcrn = tcg_const_tl(tcg_ctx, SPR(ctx->opcode));
    gen_helper_load_dcr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, dcrn);
    tcg_temp_free(tcg_ctx, dcrn);
}